

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveCounter.cpp
# Opt level: O0

void __thiscall glcts::GeometryShaderPrimitiveCounter::deinit(GeometryShaderPrimitiveCounter *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  GeometryShaderPrimitiveCounter *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x1680))(0);
  (**(code **)(lVar3 + 0x40))(0x8892,0);
  (**(code **)(lVar3 + 0xd8))(0);
  if (this->m_program_id != 0) {
    (**(code **)(lVar3 + 0x448))(this->m_program_id);
  }
  if (this->m_vertex_shader_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_vertex_shader_id);
  }
  if (this->m_geometry_shader_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_geometry_shader_id);
  }
  if (this->m_fragment_shader_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_fragment_shader_id);
  }
  if (this->m_vbo != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_vbo);
  }
  if (this->m_tbo != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_tbo);
  }
  if (this->m_vao != 0) {
    (**(code **)(lVar3 + 0x490))(1,&this->m_vao);
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GeometryShaderPrimitiveCounter::deinit(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset OpenGL ES state */
	gl.useProgram(0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	gl.bindVertexArray(0);

	/* Delete program object and shader objects */
	if (m_program_id != 0)
	{
		gl.deleteProgram(m_program_id);
	}

	if (m_vertex_shader_id != 0)
	{
		gl.deleteShader(m_vertex_shader_id);
	}

	if (m_geometry_shader_id != 0)
	{
		gl.deleteShader(m_geometry_shader_id);
	}

	if (m_fragment_shader_id != 0)
	{
		gl.deleteShader(m_fragment_shader_id);
	}

	if (m_vbo != 0)
	{
		gl.deleteBuffers(1, &m_vbo);
	}

	if (m_tbo != 0)
	{
		gl.deleteBuffers(1, &m_tbo);
	}

	if (m_vao != 0)
	{
		gl.deleteVertexArrays(1, &m_vao);
	}

	/* Deinitialize base class */
	TestCaseBase::deinit();
}